

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocaltime.cpp
# Opt level: O0

MkTimeResult * anon_unknown.dwarf_362fcb::resolveLocalTime(qint64 local,TransitionOptions resolve)

{
  tm base_00;
  MkTimeResult result_00;
  bool bVar1;
  Int in_EDX;
  longlong in_RSI;
  MkTimeResult *in_RDI;
  long in_FS_OFFSET;
  tm copy;
  tm base;
  R_conflict3 localDaySecs;
  MkTimeResult flipped_1;
  MkTimeResult flipped;
  MkTimeResult result;
  undefined8 in_stack_fffffffffffffcc8;
  TransitionOption flag;
  QFlags<QDateTimePrivate::TransitionOption> *in_stack_fffffffffffffcd0;
  tm *in_stack_fffffffffffffcd8;
  MkTimeResult *in_stack_fffffffffffffce0;
  tm *in_stack_fffffffffffffce8;
  MkTimeResult *in_stack_fffffffffffffcf0;
  QFlags<QDateTimePrivate::TransitionOption> local_28c;
  undefined1 local_288 [32];
  uint local_268;
  Int local_24c;
  QFlagsStorage<QDateTimePrivate::TransitionOption> local_248;
  Int local_244;
  undefined1 local_240 [56];
  undefined1 local_208 [36];
  QFlagsStorage<QDateTimePrivate::TransitionOption> in_stack_fffffffffffffe1c;
  QFlagsStorage<QDateTimePrivate::TransitionOption> local_1bc;
  MkTimeResult local_1b8;
  undefined1 local_170 [48];
  undefined1 in_stack_fffffffffffffec0 [16];
  byte in_stack_fffffffffffffed0;
  byte in_stack_fffffffffffffed1;
  undefined1 in_stack_fffffffffffffed2 [38];
  undefined1 in_stack_fffffffffffffef8 [32];
  byte in_stack_ffffffffffffff18;
  byte in_stack_ffffffffffffff19;
  undefined1 in_stack_ffffffffffffff1a [38];
  undefined1 local_98 [72];
  undefined1 local_50 [32];
  int local_30;
  byte local_10;
  byte local_f;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_1bc.i = in_EDX;
  QRoundingDown::qDivMod<86400U,_long_long,_true>(in_RSI);
  memset(local_208,0xaa,0x38);
  timeToTm((qint64)in_stack_fffffffffffffcd8,(int)((ulong)in_stack_fffffffffffffcd0 >> 0x20));
  memset(local_50,0xaa,0x48);
  MkTimeResult::MkTimeResult(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
  if ((local_10 & 1) == 0) {
    memcpy(local_240,local_208,0x38);
    memcpy(local_98,local_50,0x48);
    local_244 = local_1bc.i;
    base_00.tm_mon._0_1_ = in_stack_fffffffffffffed0;
    base_00.tm_sec = in_stack_fffffffffffffec0._0_4_;
    base_00.tm_min = in_stack_fffffffffffffec0._4_4_;
    base_00.tm_hour = in_stack_fffffffffffffec0._8_4_;
    base_00.tm_mday = in_stack_fffffffffffffec0._12_4_;
    base_00.tm_mon._1_1_ = in_stack_fffffffffffffed1;
    base_00._18_38_ = in_stack_fffffffffffffed2;
    result_00.local.tm_isdst._0_1_ = in_stack_ffffffffffffff18;
    result_00.local.tm_sec = in_stack_fffffffffffffef8._0_4_;
    result_00.local.tm_min = in_stack_fffffffffffffef8._4_4_;
    result_00.local.tm_hour = in_stack_fffffffffffffef8._8_4_;
    result_00.local.tm_mday = in_stack_fffffffffffffef8._12_4_;
    result_00.local.tm_mon = in_stack_fffffffffffffef8._16_4_;
    result_00.local.tm_year = in_stack_fffffffffffffef8._20_4_;
    result_00.local.tm_wday = in_stack_fffffffffffffef8._24_4_;
    result_00.local.tm_yday = in_stack_fffffffffffffef8._28_4_;
    result_00.local.tm_isdst._1_1_ = in_stack_ffffffffffffff19;
    result_00._34_38_ = in_stack_ffffffffffffff1a;
    resolveRejected(base_00,result_00,(TransitionOptions)in_stack_fffffffffffffe1c.i);
    goto LAB_0017175f;
  }
  if (-1 < local_30) {
    flag = (TransitionOption)((ulong)in_stack_fffffffffffffcc8 >> 0x20);
    if ((local_f & 1) == 0) {
      bVar1 = QFlags<QDateTimePrivate::TransitionOption>::testFlag(in_stack_fffffffffffffcd0,flag);
      if ((!bVar1) ||
         (bVar1 = QFlags<QDateTimePrivate::TransitionOption>::testFlag
                            (in_stack_fffffffffffffcd0,flag), !bVar1)) {
        memset(local_288,0xaa,0x38);
        memcpy(local_288,local_208,0x38);
        local_268 = (uint)((local_30 != 0 ^ 0xffU) & 1);
        memset(local_170,0xaa,0x48);
        MkTimeResult::MkTimeResult(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
        if (((in_stack_fffffffffffffed0 & 1) != 0) && ((in_stack_fffffffffffffed1 & 1) == 0)) {
          QFlags<QDateTimePrivate::TransitionOption>::QFlags(in_stack_fffffffffffffcd0,flag);
          bVar1 = QFlags<QDateTimePrivate::TransitionOption>::testAnyFlags
                            ((QFlags<QDateTimePrivate::TransitionOption> *)&local_1bc,local_28c);
          if (!bVar1) {
            MkTimeResult::MkTimeResult(&local_1b8);
            memcpy(local_50,&local_1b8,0x42);
            memcpy(in_RDI,local_50,0x48);
            goto LAB_0017175f;
          }
          bVar1 = preferAlternative((QFlagsStorageHelper<QDateTimePrivate::TransitionOption,_4>)
                                    SUB84((ulong)in_stack_fffffffffffffcd8 >> 0x20,0),
                                    (int)in_stack_fffffffffffffcd8,
                                    (int)((ulong)in_stack_fffffffffffffcd0 >> 0x20),
                                    SUB81((ulong)in_stack_fffffffffffffcd0 >> 0x18,0),
                                    SUB81((ulong)in_stack_fffffffffffffcd0 >> 0x10,0));
          if (bVar1) {
            memcpy(local_50,local_170,0x42);
          }
        }
      }
    }
    else {
      QFlags<QDateTimePrivate::TransitionOption>::QFlags(in_stack_fffffffffffffcd0,flag);
      bVar1 = QFlags<QDateTimePrivate::TransitionOption>::testAnyFlags
                        ((QFlags<QDateTimePrivate::TransitionOption> *)&local_1bc,
                         (QFlags<QDateTimePrivate::TransitionOption>)local_248.i);
      if (!bVar1) {
        MkTimeResult::MkTimeResult((MkTimeResult *)&stack0xffffffffffffff20);
        memcpy(local_50,&stack0xffffffffffffff20,0x42);
        memcpy(in_RDI,local_50,0x48);
        goto LAB_0017175f;
      }
      memset(&stack0xfffffffffffffed8,0xaa,0x48);
      hopAcrossGap(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
      local_24c = local_1bc.i;
      bVar1 = preferAlternative((QFlagsStorageHelper<QDateTimePrivate::TransitionOption,_4>)
                                SUB84((ulong)in_stack_fffffffffffffcd8 >> 0x20,0),
                                (int)in_stack_fffffffffffffcd8,
                                (int)((ulong)in_stack_fffffffffffffcd0 >> 0x20),
                                SUB81((ulong)in_stack_fffffffffffffcd0 >> 0x18,0),
                                SUB81((ulong)in_stack_fffffffffffffcd0 >> 0x10,0));
      if (bVar1) {
        if (((in_stack_ffffffffffffff18 & 1) == 0) || ((in_stack_ffffffffffffff19 & 1) != 0)) {
          MkTimeResult::MkTimeResult(in_RDI);
          goto LAB_0017175f;
        }
        memcpy(local_50,&stack0xfffffffffffffed8,0x42);
        local_f = 1;
      }
    }
  }
  memcpy(in_RDI,local_50,0x48);
LAB_0017175f:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

MkTimeResult resolveLocalTime(qint64 local, QDateTimePrivate::TransitionOptions resolve)
{
    const auto localDaySecs = QRoundingDown::qDivMod<SECS_PER_DAY>(local);
    struct tm base = timeToTm(localDaySecs.quotient, localDaySecs.remainder);

    // Get provisional result (correct > 99.9 % of the time):
    MkTimeResult result(base);

    // Our callers (mostly) deal with questions of being within the range that
    // system time_t functions can handle, and timeToTm() gave us data in
    // normalized form, so the only excuse for !good or a change to the HH:mm:ss
    // fields (aside from being at the boundary of time_t's supported range) is
    // that we hit a gap, although we have to handle these cases differently:
    if (!result.good) {
        // Rejected. The tricky case: maybe mktime() doesn't resolve gaps.
        return resolveRejected(base, result, resolve);
    } else if (result.local.tm_isdst < 0) {
        // Apparently success without knowledge of whether this is DST or not.
        // Should not happen, but that means our usual understanding of what the
        // system is up to has gone out the window. So just let it be.
    } else if (result.adjusted) {
        // Shunted out of a gap.
        if (!resolve.testAnyFlags(QDateTimePrivate::GapMask)) {
            result = {};
            return result;
        }

        // Try to obtain a matching point on the other side of the gap:
        const MkTimeResult flipped = hopAcrossGap(result, base);
        // Even if that failed, result may be the correct resolution

        if (preferAlternative(resolve, result.local.tm_isdst, flipped.local.tm_isdst,
                              flipped.utcSecs > result.utcSecs, true)) {
            // If hopAcrossGap() failed and we do need its answer, give up.
            if (!flipped.good || flipped.adjusted)
                return {};

            // As resolution of local, flipped involves adjustment (across gap):
            result = flipped;
            result.adjusted = true;
        }
    } else if (resolve.testFlag(QDateTimePrivate::FlipForReverseDst)
               // In fold, DST counts as before and standard as after -
               // we may not need to check whether we're in a transition:
               && resolve.testFlag(result.local.tm_isdst ? QDateTimePrivate::FoldUseBefore
                                                         : QDateTimePrivate::FoldUseAfter)) {
        // We prefer DST or standard and got what we wanted, so we're good.
        // As below, but we don't need to check, because we're on the side of
        // the transition that it would select as valid, if we were near one.
        // NB: this branch is routinely exercised, when QDT::Data::isShort()
        // obliges us to rediscover an offsetFromUtc that ShortData has no space
        // to store, as it does remember the DST status we got before.
    } else {
        // What we gave was valid. However, it might have been in a fall-back.
        // If so, the same input but with tm_isdst flipped should also be valid.
        struct tm copy = base;
        copy.tm_isdst = !result.local.tm_isdst;
        const MkTimeResult flipped(copy);
        if (flipped.good && !flipped.adjusted) {
            // We're in a fall-back
            if (!resolve.testAnyFlags(QDateTimePrivate::FoldMask)) {
                result = {};
                return result;
            }

            // Work out which repeat to use:
            if (preferAlternative(resolve, result.local.tm_isdst, flipped.local.tm_isdst,
                                  flipped.utcSecs > result.utcSecs, false)) {
                result = flipped;
            }
        } // else: not in a transition, nothing to worry about.
    }
    return result;
}